

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

map<unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
* __thiscall
adios2::core::Engine::DoAllStepsBlocksInfoStruct
          (map<unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
           *__return_storage_ptr__,Engine *this,VariableStruct *variable)

{
  _Rb_tree_header *p_Var1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"DoAllStepsBlocksInfo",&local_39);
  ThrowUp(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  return __return_storage_ptr__;
}

Assistant:

std::map<size_t, std::vector<VariableStruct::BPInfo>>
Engine::DoAllStepsBlocksInfoStruct(const VariableStruct &variable) const
{
    ThrowUp("DoAllStepsBlocksInfo");
    return std::map<size_t, std::vector<VariableStruct::BPInfo>>();
}